

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

_Bool skip_interp_filter_search(AV1_COMP *cpi,int is_single_pred)

{
  MODE MVar1;
  bool local_18;
  _Bool local_17;
  _Bool local_16;
  MODE encoding_mode;
  int is_single_pred_local;
  AV1_COMP *cpi_local;
  _Bool local_1;
  
  MVar1 = (cpi->oxcf).mode;
  if (MVar1 == '\x01') {
    local_16 = false;
    if ((cpi->common).current_frame.reference_mode == '\0') {
      local_17 = true;
      if ((cpi->sf).interp_sf.skip_interp_filter_search == 0) {
        local_17 = (cpi->sf).winner_mode_sf.winner_mode_ifs != 0;
      }
      local_16 = local_17;
    }
    local_1 = local_16;
  }
  else if (MVar1 == '\0') {
    local_18 = (cpi->sf).interp_sf.skip_interp_filter_search != 0 && is_single_pred != 0;
    local_1 = local_18;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static inline bool skip_interp_filter_search(const AV1_COMP *cpi,
                                             int is_single_pred) {
  const MODE encoding_mode = cpi->oxcf.mode;
  if (encoding_mode == REALTIME) {
    return (cpi->common.current_frame.reference_mode == SINGLE_REFERENCE &&
            (cpi->sf.interp_sf.skip_interp_filter_search ||
             cpi->sf.winner_mode_sf.winner_mode_ifs));
  } else if (encoding_mode == GOOD) {
    // Skip interpolation filter search for single prediction modes.
    return (cpi->sf.interp_sf.skip_interp_filter_search && is_single_pred);
  }
  return false;
}